

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<char*>(string *__return_storage_ptr__,tinyformat *this,char *fmt,char **args)

{
  ostringstream local_198 [8];
  ostringstream oss;
  char **args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  format<char*>((ostream *)local_198,(char *)this,(char **)fmt);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}